

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::InterfaceBlockActiveVariablesTestCase::iterate
          (InterfaceBlockActiveVariablesTestCase *this)

{
  ostringstream *poVar1;
  undefined1 *puVar2;
  Storage SVar3;
  RenderContext *renderCtx;
  TestLog *pTVar4;
  GLint aGVar5 [2];
  Shader *pSVar6;
  long lVar7;
  GLint GVar8;
  pointer pbVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  undefined4 uVar11;
  int iVar12;
  deUint32 dVar13;
  undefined4 extraout_var;
  GLint (*paGVar14) [2];
  undefined4 extraout_var_00;
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
  *pvVar15;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var16;
  undefined4 extraout_var_01;
  InternalError *this_00;
  GLint aGVar17 [2];
  Program *pPVar18;
  char *pcVar19;
  char *extraout_RDX;
  char *extraout_RDX_00;
  InterfaceBlock *interfaceBlock;
  undefined4 uVar20;
  undefined4 uVar21;
  size_type __new_size;
  bool bVar22;
  int interfaceNdx;
  long lVar23;
  size_type sVar24;
  long lVar25;
  long lVar26;
  Functional *this_01;
  GLint written_1;
  undefined4 local_33c;
  GLint retBuffer [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328;
  GLenum props [1];
  undefined4 uStack_314;
  int local_300;
  GLint nameLength;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  activeResourceNames;
  GLenum nameProp;
  MessageBuilder builder;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  blockNames;
  GLint written;
  undefined4 uStack_124;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_120;
  pointer local_118;
  ScopedLogSection section;
  ShaderProgram program;
  
  SVar3 = (this->super_InterfaceBlockBaseCase).m_storage;
  uVar20 = 0x92e5;
  if (SVar3 != STORAGE_BUFFER) {
    uVar20 = 0;
  }
  pPVar18 = (Program *)&DAT_00000001;
  if (SVar3 != STORAGE_UNIFORM) {
    pPVar18 = (Program *)(ulong)((SVar3 != STORAGE_BUFFER) + 7);
  }
  uVar21 = *(undefined4 *)
            (Functional::(anonymous_namespace)::
             getProgramInterfaceGLEnum(deqp::gles31::Functional::ProgramInterface)::s_enums +
            (long)pPVar18 * 4);
  uVar11 = 0x92e1;
  if (SVar3 != STORAGE_UNIFORM) {
    uVar11 = uVar20;
  }
  getProgramInterfaceResourceList_abi_cxx11_
            (&blockNames,(Functional *)(this->super_InterfaceBlockBaseCase).m_program,pPVar18,
             PROGRAMINTERFACE_UNIFORM);
  renderCtx = ((this->super_InterfaceBlockBaseCase).super_TestCase.m_context)->m_renderCtx;
  generateProgramInterfaceProgramSources
            ((ProgramSources *)&builder,(this->super_InterfaceBlockBaseCase).m_program);
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,(ProgramSources *)&builder);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>.field_0xa8);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            ((vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> *)
             &builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>.field_0x88);
  lVar23 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&builder.m_log + lVar23));
    lVar23 = lVar23 + -0x18;
  } while (lVar23 != -0x18);
  tcu::TestContext::setTestResult
            ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  pPVar18 = (this->super_InterfaceBlockBaseCase).m_program;
  iVar12 = (*((this->super_InterfaceBlockBaseCase).super_TestCase.m_context)->m_renderCtx->
             _vptr_RenderContext[3])();
  checkAndLogProgram(&program,pPVar18,(Functions *)CONCAT44(extraout_var,iVar12),
                     ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx)->m_log);
  if ((int)((ulong)((long)blockNames.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)blockNames.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 5) < 1) {
    local_300 = 0;
  }
  else {
    lVar23 = 0;
    local_300 = 0;
    local_33c = uVar21;
    do {
      pTVar4 = ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx)->m_log;
      builder.m_log =
           (TestLog *)&builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&builder,"Block","");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &activeResourceNames,"Block \"",
                     blockNames.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar23);
      paGVar14 = (GLint (*) [2])std::__cxx11::string::append((char *)&activeResourceNames);
      retBuffer = (GLint  [2])&local_328;
      aGVar17 = (GLint  [2])(paGVar14 + 2);
      if (*paGVar14 == aGVar17) {
        local_328._M_allocated_capacity = *(undefined8 *)aGVar17;
        local_328._8_8_ = paGVar14[3];
      }
      else {
        local_328._M_allocated_capacity = *(undefined8 *)aGVar17;
        retBuffer = *paGVar14;
      }
      aGVar5 = paGVar14[1];
      *paGVar14 = aGVar17;
      paGVar14[1] = (GLint  [2])0x0;
      *(undefined1 *)paGVar14[2] = 0;
      tcu::ScopedLogSection::ScopedLogSection
                (&section,pTVar4,(string *)&builder,(string *)retBuffer);
      if (retBuffer != (GLint  [2])&local_328) {
        operator_delete((void *)retBuffer,local_328._M_allocated_capacity + 1);
      }
      if (activeResourceNames.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&activeResourceNames.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(activeResourceNames.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&((activeResourceNames.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       _M_dataplus)._M_p + 1));
      }
      if (builder.m_log !=
          (TestLog *)&builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8) {
        operator_delete(builder.m_log,
                        builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ + 1);
      }
      iVar12 = (*((this->super_InterfaceBlockBaseCase).super_TestCase.m_context)->m_renderCtx->
                 _vptr_RenderContext[3])();
      lVar25 = CONCAT44(extraout_var_00,iVar12);
      iVar12 = (**(code **)(lVar25 + 0x9a8))
                         (program.m_program.m_program,uVar21,
                          blockNames.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar23]._M_dataplus._M_p);
      activeResourceNames.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      activeResourceNames.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      activeResourceNames.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      dVar13 = (**(code **)(lVar25 + 0x800))();
      glu::checkError(dVar13,"query resource index",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                      ,0x72c);
      if (iVar12 == -1) {
        builder.m_log =
             ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
        poVar1 = &builder.m_str;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                   "Error, getProgramResourceIndex returned GL_INVALID_INDEX for \"",0x3e);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                   blockNames.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar23]._M_dataplus._M_p,
                   blockNames.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar23]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"\"",1);
        tcu::MessageBuilder::operator<<(&builder,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
        std::ios_base::~ios_base
                  ((ios_base *)
                   &builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
        tcu::TestContext::setTestResult
                  ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.super_TestNode
                   .m_testCtx,QP_TEST_RESULT_FAIL,"Resource not found");
      }
      else {
        _props = (pointer)CONCAT44(uStack_314,0x9304);
        retBuffer[0] = -1;
        retBuffer[1] = -1;
        _written = (pointer)CONCAT44(uStack_124,0xffffffff);
        (**(code **)(lVar25 + 0x9c8))
                  (program.m_program.m_program,uVar21,iVar12,1,props,1,&written,retBuffer);
        dVar13 = (**(code **)(lVar25 + 0x800))();
        glu::checkError(dVar13,"query GL_NUM_ACTIVE_VARIABLES",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                        ,0x73d);
        GVar8 = retBuffer[0];
        __new_size = (size_type)retBuffer[0];
        if (local_300 <= retBuffer[0]) {
          local_300 = retBuffer[0];
        }
        builder.m_log =
             ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&builder.m_str);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>,
                   "NUM_ACTIVE_VARIABLES = ",0x17);
        std::ostream::operator<<(&builder.m_str,GVar8);
        tcu::MessageBuilder::operator<<(&builder,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&builder.m_str);
        std::ios_base::~ios_base
                  ((ios_base *)
                   &builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
        if (retBuffer[0] == -1 || written == -1) {
          builder.m_log =
               ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&builder.m_str);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>,
                     "Error, Query for NUM_ACTIVE_VARIABLES did not return a value",0x3c);
          uVar21 = local_33c;
          tcu::MessageBuilder::operator<<(&builder,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&builder.m_str);
          std::ios_base::~ios_base
                    ((ios_base *)
                     &builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
          pcVar19 = "Query for NUM_ACTIVE_VARIABLES failed";
        }
        else if (retBuffer[1] == -1) {
          if (-1 < retBuffer[0]) {
            _written = (pointer)CONCAT44(uStack_124,0x9305);
            builder.m_log = (TestLog *)CONCAT44(builder.m_log._4_4_,0xffffffff);
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)retBuffer,(long)(GVar8 + 1),
                       (value_type_conflict1 *)&builder,(allocator_type *)props);
            written_1 = -1;
            (**(code **)(lVar25 + 0x9c8))
                      (program.m_program.m_program,local_33c,iVar12,1,&written,
                       (ulong)((long)aGVar5 - (long)retBuffer) >> 2,&written_1,retBuffer);
            dVar13 = (**(code **)(lVar25 + 0x800))();
            glu::checkError(dVar13,"query GL_ACTIVE_VARIABLES",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                            ,0x75f);
            if (written_1 == -1) {
              builder.m_log =
                   ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                    super_TestNode.m_testCtx)->m_log;
              poVar1 = &builder.m_str;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                         "Error, Query for GL_ACTIVE_VARIABLES did not return any values",0x3e);
              tcu::MessageBuilder::operator<<(&builder,(EndMessageToken *)&tcu::TestLog::EndMessage)
              ;
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
              std::ios_base::~ios_base
                        ((ios_base *)
                         &builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>.
                          field_0x70);
              pcVar19 = "Query for GL_ACTIVE_VARIABLES failed";
            }
            else if (written_1 == GVar8) {
              if (*(int *)((long)aGVar5 - 4) == -1) {
                builder.m_log =
                     ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx)->m_log;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&builder.m_str);
                std::__ostream_insert<char,std::char_traits<char>>
                          (&builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>,
                           "Active variable indices: {",0x1a);
                if (0 < GVar8) {
                  sVar24 = 0;
                  do {
                    if (sVar24 != 0) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                (&builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>,
                                 ", ",2);
                    }
                    std::ostream::operator<<(&builder.m_str,*(int *)((long)retBuffer + sVar24 * 4));
                    sVar24 = sVar24 + 1;
                  } while (__new_size != sVar24);
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          (&builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>,"}",1);
                tcu::MessageBuilder::operator<<
                          (&builder,(EndMessageToken *)&tcu::TestLog::EndMessage);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&builder.m_str);
                std::ios_base::~ios_base
                          ((ios_base *)
                           &builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>.
                            field_0x70);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::resize(&activeResourceNames,__new_size);
                if (0 < GVar8) {
                  sVar24 = 0;
                  do {
                    nameProp = 0x92f9;
                    nameLength = -1;
                    _props = (pointer)0x0;
                    written_1 = -1;
                    (**(code **)(lVar25 + 0x9c8))
                              (program.m_program.m_program,uVar11,
                               *(undefined4 *)((long)retBuffer + sVar24 * 4),1,&nameProp,1,
                               &written_1,&nameLength);
                    dVar13 = (**(code **)(lVar25 + 0x800))();
                    glu::checkError(dVar13,"query GL_NAME_LENGTH",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                                    ,0x78e);
                    if ((nameLength < 1) || (written_1 < 1)) {
                      builder.m_log =
                           ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                            super_TestNode.m_testCtx)->m_log;
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)&builder.m_str);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (&builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>,
                                 "Error, GL_NAME_LENGTH query failed",0x22);
                      tcu::MessageBuilder::operator<<
                                (&builder,(EndMessageToken *)&tcu::TestLog::EndMessage);
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&builder.m_str);
                      std::ios_base::~ios_base
                                ((ios_base *)
                                 &builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>.
                                  field_0x70);
                      pcVar19 = "GL_NAME_LENGTH query failed";
LAB_0155ff3d:
                      tcu::TestContext::setTestResult
                                ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                                 super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,pcVar19);
                    }
                    else {
                      builder.m_log = (TestLog *)CONCAT71(builder.m_log._1_7_,0x58);
                      std::vector<char,_std::allocator<char>_>::resize
                                ((vector<char,_std::allocator<char>_> *)props,(long)(nameLength + 2)
                                 ,(value_type *)&builder);
                      written_1 = -1;
                      (**(code **)(lVar25 + 0x9c0))
                                (program.m_program.m_program,uVar11,
                                 *(undefined4 *)((long)retBuffer + sVar24 * 4),nameLength + 1,
                                 &written_1,_props);
                      dVar13 = (**(code **)(lVar25 + 0x800))();
                      glu::checkError(dVar13,"getProgramResourceName",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                                      ,0x79a);
                      if ((long)written_1 < 1) {
                        builder.m_log =
                             ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                              super_TestNode.m_testCtx)->m_log;
                        std::__cxx11::ostringstream::ostringstream((ostringstream *)&builder.m_str);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (&builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>
                                   ,"Error, name query failed, no data written",0x29);
                        tcu::MessageBuilder::operator<<
                                  (&builder,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_0155ff15:
                        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&builder.m_str)
                        ;
                        std::ios_base::~ios_base
                                  ((ios_base *)
                                   &builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>
                                    .field_0x70);
                        pcVar19 = "name query failed";
                        goto LAB_0155ff3d;
                      }
                      if (nameLength < written_1) {
                        builder.m_log =
                             ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                              super_TestNode.m_testCtx)->m_log;
                        std::__cxx11::ostringstream::ostringstream((ostringstream *)&builder.m_str);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (&builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>
                                   ,"Error, name query failed, query returned too much data",0x36);
                        tcu::MessageBuilder::operator<<
                                  (&builder,(EndMessageToken *)&tcu::TestLog::EndMessage);
                        goto LAB_0155ff15;
                      }
                      builder.m_log =
                           (TestLog *)
                           &builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>.
                            field_0x8;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&builder,_props,
                                 (pointer)((long)&(_props->_M_dataplus)._M_p + (long)written_1));
                      std::__cxx11::string::operator=
                                ((string *)
                                 (activeResourceNames.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + sVar24),
                                 (string *)&builder);
                      if (builder.m_log !=
                          (TestLog *)
                          &builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>.
                           field_0x8) {
                        operator_delete(builder.m_log,
                                        builder.m_str.
                                        super_basic_ostream<char,_std::char_traits<char>_>._8_8_ + 1
                                       );
                      }
                    }
                    if (_props != (pointer)0x0) {
                      operator_delete(_props,-(long)_props);
                    }
                    sVar24 = sVar24 + 1;
                  } while (sVar24 != __new_size);
                }
                builder.m_log =
                     ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx)->m_log;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&builder.m_str);
                std::__ostream_insert<char,std::char_traits<char>>
                          (&builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>,
                           "Active variables:\n",0x12);
                if (0 < GVar8) {
                  lVar25 = 0;
                  do {
                    poVar1 = &builder.m_str;
                    std::__ostream_insert<char,std::char_traits<char>>
                              (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"\t",1);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                               *(char **)((long)&((activeResourceNames.
                                                                                                      
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                 _M_dataplus)._M_p + lVar25),
                               *(long *)((long)&(activeResourceNames.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->
                                                _M_string_length + lVar25));
                    std::__ostream_insert<char,std::char_traits<char>>
                              (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
                    lVar25 = lVar25 + 0x20;
                  } while (__new_size * 0x20 != lVar25);
                }
                tcu::MessageBuilder::operator<<
                          (&builder,(EndMessageToken *)&tcu::TestLog::EndMessage);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&builder.m_str);
                std::ios_base::~ios_base
                          ((ios_base *)
                           &builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>.
                            field_0x70);
                pcVar19 = extraout_RDX;
                if (retBuffer != (GLint  [2])0x0) {
                  operator_delete((void *)retBuffer,
                                  local_328._M_allocated_capacity - (long)retBuffer);
                  pcVar19 = extraout_RDX_00;
                }
                glu::parseVariableName_abi_cxx11_
                          ((string *)retBuffer,
                           (glu *)blockNames.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[lVar23]._M_dataplus._M_p
                           ,pcVar19);
                _props = (pointer)0x0;
                lVar26 = 0;
                lVar25 = 0;
                while( true ) {
                  pvVar15 = ProgramInterfaceDefinition::Program::getShaders
                                      ((this->super_InterfaceBlockBaseCase).m_program);
                  pSVar6 = *(pvVar15->
                            super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                            )._M_impl.super__Vector_impl_data._M_start;
                  if ((int)((ulong)((long)(pSVar6->m_defaultBlock).interfaceBlocks.
                                          super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   *(long *)&(pSVar6->m_defaultBlock).interfaceBlocks.
                                             super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                                             ._M_impl.super__Vector_impl_data) >> 4) * 0x38e38e39 <=
                      lVar25) goto LAB_015608b6;
                  pvVar15 = ProgramInterfaceDefinition::Program::getShaders
                                      ((this->super_InterfaceBlockBaseCase).m_program);
                  lVar7 = *(long *)&((*(pvVar15->
                                       super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                                       )._M_impl.super__Vector_impl_data._M_start)->m_defaultBlock).
                                    interfaceBlocks.
                                    super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                                    ._M_impl.super__Vector_impl_data;
                  aGVar17 = *(GLint (*) [2])(lVar7 + 0x28 + lVar26);
                  if ((aGVar17 == aGVar5) &&
                     ((aGVar17 == (GLint  [2])0x0 ||
                      (iVar12 = bcmp(*(void **)(lVar7 + 0x20 + lVar26),(void *)retBuffer,
                                     (size_t)aGVar17), iVar12 == 0)))) break;
                  lVar25 = lVar25 + 1;
                  lVar26 = lVar26 + 0x90;
                }
                pvVar15 = ProgramInterfaceDefinition::Program::getShaders
                                    ((this->super_InterfaceBlockBaseCase).m_program);
                this_01 = (Functional *)
                          (lVar26 + *(long *)&((*(pvVar15->
                                                 super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->
                                              m_defaultBlock).interfaceBlocks.
                                              super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                                              ._M_impl.super__Vector_impl_data);
                if (this_01 == (Functional *)0x0) {
LAB_015608b6:
                  this_00 = (InternalError *)__cxa_allocate_exception(0x38);
                  builder.m_log =
                       (TestLog *)
                       &builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&builder,
                             "could not find block referenced in the reference resource list","");
                  tcu::InternalError::InternalError(this_00,(string *)&builder);
                  __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
                }
                getProgramInterfaceBlockMemberResourceList_abi_cxx11_
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&written,this_01,interfaceBlock);
                pbVar10 = pbStack_120;
                builder.m_log = (TestLog *)_props;
                _props = _written;
                builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                     = (_func_int **)0x0;
                builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = 0;
                _written = (pointer)0x0;
                pbStack_120 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0;
                local_118 = (pointer)0x0;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&builder);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&written);
                builder.m_log =
                     ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx)->m_log;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&builder.m_str);
                std::__ostream_insert<char,std::char_traits<char>>
                          (&builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>,
                           "Expected variable names:\n",0x19);
                if (0 < (int)((ulong)((long)pbVar10 - (long)_props) >> 5)) {
                  lVar25 = 8;
                  lVar26 = 0;
                  do {
                    poVar1 = &builder.m_str;
                    std::__ostream_insert<char,std::char_traits<char>>
                              (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"\t",1);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                               *(char **)((long)_props + lVar25 + -8),
                               *(long *)((long)&(_props->_M_dataplus)._M_p + lVar25));
                    std::__ostream_insert<char,std::char_traits<char>>
                              (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
                    lVar26 = lVar26 + 1;
                    lVar25 = lVar25 + 0x20;
                  } while (lVar26 < (int)((ulong)((long)pbVar10 - (long)_props) >> 5));
                }
                tcu::MessageBuilder::operator<<
                          (&builder,(EndMessageToken *)&tcu::TestLog::EndMessage);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&builder.m_str);
                std::ios_base::~ios_base
                          ((ios_base *)
                           &builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>.
                            field_0x70);
                bVar22 = true;
                if (0 < (int)((ulong)((long)pbVar10 - (long)_props) >> 5)) {
                  lVar25 = 0;
                  lVar26 = 0;
                  do {
                    pbVar9 = activeResourceNames.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                    _Var16 = std::
                             __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                                       (activeResourceNames.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        activeResourceNames.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish,
                                        (pointer)((long)&(_props->_M_dataplus)._M_p + lVar25));
                    if (_Var16._M_current == pbVar9) {
                      builder.m_log =
                           ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                            super_TestNode.m_testCtx)->m_log;
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)&builder.m_str);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (&builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>,
                                 "Error, variable name list did not contain active variable ",0x3a);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (&builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>,
                                 *(char **)((long)&(_props->_M_dataplus)._M_p + lVar25),
                                 *(long *)((long)&_props->_M_string_length + lVar25));
                      tcu::MessageBuilder::operator<<
                                (&builder,(EndMessageToken *)&tcu::TestLog::EndMessage);
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&builder.m_str);
                      std::ios_base::~ios_base
                                ((ios_base *)
                                 &builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>.
                                  field_0x70);
                      bVar22 = false;
                    }
                    lVar26 = lVar26 + 1;
                    lVar25 = lVar25 + 0x20;
                  } while (lVar26 < (int)((ulong)((long)pbVar10 - (long)_props) >> 5));
                }
                if (0 < (int)((ulong)((long)activeResourceNames.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)activeResourceNames.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 5)) {
                  lVar25 = 0;
                  lVar26 = 0;
                  do {
                    _Var16 = std::
                             __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                                       (_props,pbVar10,
                                        (long)&((activeResourceNames.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->
                                               _M_dataplus)._M_p + lVar25);
                    if (_Var16._M_current == pbVar10) {
                      builder.m_log =
                           ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                            super_TestNode.m_testCtx)->m_log;
                      poVar1 = &builder.m_str;
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                                 "Error, variable name list contains unexpected resource \"",0x38);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                                 *(char **)((long)&((activeResourceNames.
                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + lVar25),
                                 *(long *)((long)&(activeResourceNames.
                                                                                                      
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_string_length + lVar25));
                      std::__ostream_insert<char,std::char_traits<char>>
                                (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"\"",1)
                      ;
                      tcu::MessageBuilder::operator<<
                                (&builder,(EndMessageToken *)&tcu::TestLog::EndMessage);
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
                      std::ios_base::~ios_base
                                ((ios_base *)
                                 &builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>.
                                  field_0x70);
                      bVar22 = false;
                    }
                    lVar26 = lVar26 + 1;
                    lVar25 = lVar25 + 0x20;
                  } while (lVar26 < (int)((ulong)((long)activeResourceNames.
                                                                                                                
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                 (long)activeResourceNames.
                                                                                                              
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 5));
                }
                if (bVar22) {
                  builder.m_log =
                       ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx)->m_log;
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&builder.m_str);
                  uVar21 = local_33c;
                  std::__ostream_insert<char,std::char_traits<char>>
                            (&builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>,
                             "Lists identical",0xf);
                  tcu::MessageBuilder::operator<<
                            (&builder,(EndMessageToken *)&tcu::TestLog::EndMessage);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&builder.m_str);
                  std::ios_base::~ios_base
                            ((ios_base *)
                             &builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>.
                              field_0x70);
                }
                else {
                  builder.m_log =
                       ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx)->m_log;
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&builder.m_str);
                  uVar21 = local_33c;
                  std::__ostream_insert<char,std::char_traits<char>>
                            (&builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>,
                             "Error, invalid active variable list",0x23);
                  tcu::MessageBuilder::operator<<
                            (&builder,(EndMessageToken *)&tcu::TestLog::EndMessage);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&builder.m_str);
                  std::ios_base::~ios_base
                            ((ios_base *)
                             &builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>.
                              field_0x70);
                  tcu::TestContext::setTestResult
                            ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                             super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                             "invalid active variable list");
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)props);
                if (retBuffer != (GLint  [2])&local_328) {
                  operator_delete((void *)retBuffer,local_328._M_allocated_capacity + 1);
                }
                goto LAB_0155f8d7;
              }
              builder.m_log =
                   ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                    super_TestNode.m_testCtx)->m_log;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&builder.m_str);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>,
                         "Error, GL_ACTIVE_VARIABLES query return buffer trailing guard value was modified, getProgramResourceiv returned more than NUM_ACTIVE_VARIABLES values"
                         ,0x95);
              tcu::MessageBuilder::operator<<(&builder,(EndMessageToken *)&tcu::TestLog::EndMessage)
              ;
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&builder.m_str);
              std::ios_base::~ios_base
                        ((ios_base *)
                         &builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>.
                          field_0x70);
              pcVar19 = "Query for GL_ACTIVE_VARIABLES returned too many values";
            }
            else {
              builder.m_log =
                   ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                    super_TestNode.m_testCtx)->m_log;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&builder.m_str);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>,
                         "Error, Query for GL_ACTIVE_VARIABLES did not return NUM_ACTIVE_VARIABLES values"
                         ,0x4f);
              tcu::MessageBuilder::operator<<(&builder,(EndMessageToken *)&tcu::TestLog::EndMessage)
              ;
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&builder.m_str);
              std::ios_base::~ios_base
                        ((ios_base *)
                         &builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>.
                          field_0x70);
              pcVar19 = "Query for GL_ACTIVE_VARIABLES returned invalid number of values";
            }
            tcu::TestContext::setTestResult
                      ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                       super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,pcVar19);
            uVar21 = local_33c;
            if (retBuffer != (GLint  [2])0x0) {
              operator_delete((void *)retBuffer,local_328._M_allocated_capacity - (long)retBuffer);
              uVar21 = local_33c;
            }
            goto LAB_0155f8d7;
          }
          builder.m_log =
               ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&builder.m_str);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>,
                     "Error, NUM_ACTIVE_VARIABLES < 0",0x1f);
          uVar21 = local_33c;
          tcu::MessageBuilder::operator<<(&builder,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&builder.m_str);
          std::ios_base::~ios_base
                    ((ios_base *)
                     &builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
          pcVar19 = "NUM_ACTIVE_VARIABLES < 0";
        }
        else {
          builder.m_log =
               ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&builder.m_str);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>,
                     "Error, Query for NUM_ACTIVE_VARIABLES returned too many values",0x3e);
          uVar21 = local_33c;
          tcu::MessageBuilder::operator<<(&builder,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&builder.m_str);
          std::ios_base::~ios_base
                    ((ios_base *)
                     &builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
          pcVar19 = "Query for NUM_ACTIVE_VARIABLES returned too many values";
        }
        tcu::TestContext::setTestResult
                  ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.super_TestNode
                   .m_testCtx,QP_TEST_RESULT_FAIL,pcVar19);
      }
LAB_0155f8d7:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&activeResourceNames);
      tcu::TestLog::endSection(section.m_log);
      lVar23 = lVar23 + 1;
    } while (lVar23 < (int)((ulong)((long)blockNames.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)blockNames.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 5));
  }
  pTVar4 = ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.super_TestNode.
           m_testCtx)->m_log;
  puVar2 = &builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
  builder.m_log = (TestLog *)puVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&builder,"MaxNumActiveVariables","");
  retBuffer = (GLint  [2])&local_328;
  std::__cxx11::string::_M_construct<char_const*>((string *)retBuffer,"MAX_NUM_ACTIVE_VARIABLES","")
  ;
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&activeResourceNames,pTVar4,(string *)&builder,(string *)retBuffer)
  ;
  if (retBuffer != (GLint  [2])&local_328) {
    operator_delete((void *)retBuffer,local_328._M_allocated_capacity + 1);
  }
  if (builder.m_log != (TestLog *)puVar2) {
    operator_delete(builder.m_log,
                    builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ + 1);
  }
  iVar12 = (*((this->super_InterfaceBlockBaseCase).super_TestCase.m_context)->m_renderCtx->
             _vptr_RenderContext[3])();
  retBuffer[0] = -1;
  (**(code **)(CONCAT44(extraout_var_01,iVar12) + 0x990))(program.m_program.m_program,uVar21,0x92f7)
  ;
  dVar13 = (**(code **)(CONCAT44(extraout_var_01,iVar12) + 0x800))();
  glu::checkError(dVar13,"query MAX_NUM_ACTIVE_VARIABLES",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                  ,0x7fe);
  builder.m_log =
       ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
       ->m_log;
  poVar1 = &builder.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
             "MAX_NUM_ACTIVE_VARIABLES = ",0x1b);
  std::ostream::operator<<(poVar1,retBuffer[0]);
  tcu::MessageBuilder::operator<<(&builder,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  std::ios_base::~ios_base
            ((ios_base *)
             &builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
  if (local_300 == retBuffer[0]) {
    builder.m_log =
         ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.super_TestNode.
         m_testCtx)->m_log;
    poVar1 = &builder.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
               "MAX_NUM_ACTIVE_VARIABLES valid",0x1e);
    tcu::MessageBuilder::operator<<(&builder,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    std::ios_base::~ios_base
              ((ios_base *)
               &builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
  }
  else {
    builder.m_log =
         ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.super_TestNode.
         m_testCtx)->m_log;
    poVar1 = &builder.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
               "Error, got unexpected MAX_NUM_ACTIVE_VARIABLES",0x2e);
    tcu::MessageBuilder::operator<<(&builder,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    std::ios_base::~ios_base
              ((ios_base *)
               &builder.m_str.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
    tcu::TestContext::setTestResult
              ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,QP_TEST_RESULT_FAIL,"unexpected MAX_NUM_ACTIVE_VARIABLES");
  }
  tcu::TestLog::endSection
            ((TestLog *)
             activeResourceNames.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  glu::ShaderProgram::~ShaderProgram(&program);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&blockNames);
  return STOP;
}

Assistant:

InterfaceBlockActiveVariablesTestCase::IterateResult InterfaceBlockActiveVariablesTestCase::iterate (void)
{
	const ProgramInterface			programInterface				= (m_storage == glu::STORAGE_UNIFORM) ? (PROGRAMINTERFACE_UNIFORM_BLOCK) :
																	  (m_storage == glu::STORAGE_BUFFER) ? (PROGRAMINTERFACE_SHADER_STORAGE_BLOCK) :
																	  (PROGRAMINTERFACE_LAST);
	const glw::GLenum				programGLInterfaceValue			= getProgramInterfaceGLEnum(programInterface);
	const glw::GLenum				programMemberInterfaceValue		= (m_storage == glu::STORAGE_UNIFORM) ? (GL_UNIFORM) :
																	  (m_storage == glu::STORAGE_BUFFER) ? (GL_BUFFER_VARIABLE) :
																	  (0);
	const std::vector<std::string>	blockNames						= getProgramInterfaceResourceList(m_program, programInterface);
	glu::ShaderProgram				program							(m_context.getRenderContext(), generateProgramInterfaceProgramSources(m_program));
	int								expectedMaxNumActiveVariables	= 0;

	DE_ASSERT(programInterface != PROGRAMINTERFACE_LAST);

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	checkAndLogProgram(program, m_program, m_context.getRenderContext().getFunctions(), m_testCtx.getLog());

	// Verify all blocks

	for (int blockNdx = 0; blockNdx < (int)blockNames.size(); ++blockNdx)
	{
		const tcu::ScopedLogSection section				(m_testCtx.getLog(), "Block", "Block \"" + blockNames[blockNdx] + "\"");
		const glw::Functions&		gl					= m_context.getRenderContext().getFunctions();
		const glw::GLuint			resourceNdx			= gl.getProgramResourceIndex(program.getProgram(), programGLInterfaceValue, blockNames[blockNdx].c_str());
		glw::GLint					numActiveResources;
		std::vector<std::string>	activeResourceNames;

		GLU_EXPECT_NO_ERROR(gl.getError(), "query resource index");

		if (resourceNdx == GL_INVALID_INDEX)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Error, getProgramResourceIndex returned GL_INVALID_INDEX for \"" << blockNames[blockNdx] << "\"" << tcu::TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Resource not found");
			continue;
		}

		// query block information

		{
			const glw::GLenum	props[]			= { GL_NUM_ACTIVE_VARIABLES };
			glw::GLint			retBuffer[2]	= { -1, -1 };
			glw::GLint			written			= -1;

			gl.getProgramResourceiv(program.getProgram(), programGLInterfaceValue, resourceNdx, DE_LENGTH_OF_ARRAY(props), props, 1, &written, retBuffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "query GL_NUM_ACTIVE_VARIABLES");

			numActiveResources = retBuffer[0];
			expectedMaxNumActiveVariables = de::max(expectedMaxNumActiveVariables, numActiveResources);
			m_testCtx.getLog() << tcu::TestLog::Message << "NUM_ACTIVE_VARIABLES = " << numActiveResources << tcu::TestLog::EndMessage;

			if (written == -1 || retBuffer[0] == -1)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, Query for NUM_ACTIVE_VARIABLES did not return a value" << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Query for NUM_ACTIVE_VARIABLES failed");
				continue;
			}
			else if (retBuffer[1] != -1)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, Query for NUM_ACTIVE_VARIABLES returned too many values" << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Query for NUM_ACTIVE_VARIABLES returned too many values");
				continue;
			}
			else if (retBuffer[0] < 0)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, NUM_ACTIVE_VARIABLES < 0" << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "NUM_ACTIVE_VARIABLES < 0");
				continue;
			}
		}

		// query block variable information

		{
			const glw::GLenum			props[]					= { GL_ACTIVE_VARIABLES };
			std::vector<glw::GLint>		activeVariableIndices	(numActiveResources + 1, -1);	// Allocate one extra trailing to detect wrong write lengths
			glw::GLint					written					= -1;

			gl.getProgramResourceiv(program.getProgram(), programGLInterfaceValue, resourceNdx, DE_LENGTH_OF_ARRAY(props), props, (glw::GLsizei)activeVariableIndices.size(), &written, &activeVariableIndices[0]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "query GL_ACTIVE_VARIABLES");

			if (written == -1)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, Query for GL_ACTIVE_VARIABLES did not return any values" << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Query for GL_ACTIVE_VARIABLES failed");
				continue;
			}
			else if (written != numActiveResources)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, Query for GL_ACTIVE_VARIABLES did not return NUM_ACTIVE_VARIABLES values" << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Query for GL_ACTIVE_VARIABLES returned invalid number of values");
				continue;
			}
			else if (activeVariableIndices.back() != -1)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, GL_ACTIVE_VARIABLES query return buffer trailing guard value was modified, getProgramResourceiv returned more than NUM_ACTIVE_VARIABLES values" << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Query for GL_ACTIVE_VARIABLES returned too many values");
				continue;
			}

			// log indices
			{
				tcu::MessageBuilder builder(&m_testCtx.getLog());

				builder << "Active variable indices: {";
				for (int varNdx = 0; varNdx < numActiveResources; ++varNdx)
				{
					if (varNdx)
						builder << ", ";
					builder << activeVariableIndices[varNdx];
				}
				builder << "}" << tcu::TestLog::EndMessage;
			}

			// collect names

			activeResourceNames.resize(numActiveResources);

			for (int varNdx = 0; varNdx < numActiveResources; ++varNdx)
			{
				const glw::GLenum	nameProp	= GL_NAME_LENGTH;
				glw::GLint			nameLength	= -1;
				std::vector<char>	nameBuffer;

				written = -1;
				gl.getProgramResourceiv(program.getProgram(), programMemberInterfaceValue, activeVariableIndices[varNdx], 1, &nameProp, 1, &written, &nameLength);
				GLU_EXPECT_NO_ERROR(gl.getError(), "query GL_NAME_LENGTH");

				if (nameLength <= 0 || written <= 0)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Error, GL_NAME_LENGTH query failed" << tcu::TestLog::EndMessage;
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "GL_NAME_LENGTH query failed");
					continue;
				}

				nameBuffer.resize(nameLength + 2, 'X'); // allocate more than required
				written = -1;
				gl.getProgramResourceName(program.getProgram(), programMemberInterfaceValue, activeVariableIndices[varNdx], nameLength+1, &written, &nameBuffer[0]);
				GLU_EXPECT_NO_ERROR(gl.getError(), "getProgramResourceName");

				if (written <= 0)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Error, name query failed, no data written" << tcu::TestLog::EndMessage;
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "name query failed");
					continue;
				}
				else if (written > nameLength)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Error, name query failed, query returned too much data" << tcu::TestLog::EndMessage;
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "name query failed");
					continue;
				}

				activeResourceNames[varNdx] = std::string(&nameBuffer[0], written);
			}

			// log collected names
			{
				tcu::MessageBuilder builder(&m_testCtx.getLog());

				builder << "Active variables:\n";
				for (int varNdx = 0; varNdx < numActiveResources; ++varNdx)
					builder << "\t" << activeResourceNames[varNdx] << "\n";
				builder << tcu::TestLog::EndMessage;
			}
		}

		// verify names
		{
			glu::InterfaceBlock*		block		= DE_NULL;
			const std::string			blockName	= glu::parseVariableName(blockNames[blockNdx].c_str());
			std::vector<std::string>	referenceList;

			for (int interfaceNdx = 0; interfaceNdx < (int)m_program->getShaders()[0]->getDefaultBlock().interfaceBlocks.size(); ++interfaceNdx)
			{
				if (m_program->getShaders()[0]->getDefaultBlock().interfaceBlocks[interfaceNdx].interfaceName == blockName)
				{
					block = &m_program->getShaders()[0]->getDefaultBlock().interfaceBlocks[interfaceNdx];
					break;
				}
			}

			if (!block)
				throw tcu::InternalError("could not find block referenced in the reference resource list");

			// generate reference list

			referenceList = getProgramInterfaceBlockMemberResourceList(*block);
			{
				tcu::MessageBuilder builder(&m_testCtx.getLog());

				builder << "Expected variable names:\n";
				for (int varNdx = 0; varNdx < (int)referenceList.size(); ++varNdx)
					builder << "\t" << referenceList[varNdx] << "\n";
				builder << tcu::TestLog::EndMessage;
			}

			// compare lists
			{
				bool listsIdentical = true;

				for (int ndx = 0; ndx < (int)referenceList.size(); ++ndx)
				{
					if (!de::contains(activeResourceNames.begin(), activeResourceNames.end(), referenceList[ndx]))
					{
						m_testCtx.getLog() << tcu::TestLog::Message << "Error, variable name list did not contain active variable " << referenceList[ndx] << tcu::TestLog::EndMessage;
						listsIdentical = false;
					}
				}

				for (int ndx = 0; ndx < (int)activeResourceNames.size(); ++ndx)
				{
					if (!de::contains(referenceList.begin(), referenceList.end(), activeResourceNames[ndx]))
					{
						m_testCtx.getLog() << tcu::TestLog::Message << "Error, variable name list contains unexpected resource \"" << activeResourceNames[ndx] << "\"" << tcu::TestLog::EndMessage;
						listsIdentical = false;
					}
				}

				if (listsIdentical)
					m_testCtx.getLog() << tcu::TestLog::Message << "Lists identical" << tcu::TestLog::EndMessage;
				else
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Error, invalid active variable list" << tcu::TestLog::EndMessage;
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "invalid active variable list");
					continue;
				}
			}
		}
	}

	// Max num active variables
	{
		const tcu::ScopedLogSection	section					(m_testCtx.getLog(), "MaxNumActiveVariables", "MAX_NUM_ACTIVE_VARIABLES");
		const glw::Functions&		gl						= m_context.getRenderContext().getFunctions();
		glw::GLint					maxNumActiveVariables	= -1;

		gl.getProgramInterfaceiv(program.getProgram(), programGLInterfaceValue, GL_MAX_NUM_ACTIVE_VARIABLES, &maxNumActiveVariables);
		GLU_EXPECT_NO_ERROR(gl.getError(), "query MAX_NUM_ACTIVE_VARIABLES");

		m_testCtx.getLog() << tcu::TestLog::Message << "MAX_NUM_ACTIVE_VARIABLES = " << maxNumActiveVariables << tcu::TestLog::EndMessage;

		if (expectedMaxNumActiveVariables != maxNumActiveVariables)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Error, got unexpected MAX_NUM_ACTIVE_VARIABLES" << tcu::TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "unexpected MAX_NUM_ACTIVE_VARIABLES");
		}
		else
			m_testCtx.getLog() << tcu::TestLog::Message << "MAX_NUM_ACTIVE_VARIABLES valid" << tcu::TestLog::EndMessage;
	}

	return STOP;
}